

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

intptr_t xemmai::anon_unknown_16::f_zone_to_offset(wchar_t *a_zone)

{
  int iVar1;
  long lVar2;
  intptr_t minute;
  intptr_t hour;
  size_t i;
  wchar_t *a_zone_local;
  
  switch(*a_zone) {
  case L'+':
  case L'-':
    iVar1 = iswdigit(a_zone[1]);
    if ((iVar1 == 0) || (iVar1 = iswdigit(a_zone[2]), iVar1 == 0)) {
      a_zone_local = (wchar_t *)0x0;
    }
    else {
      iVar1 = 3;
      if (a_zone[3] == L':') {
        iVar1 = 4;
      }
      lVar2 = (long)iVar1;
      iVar1 = iswdigit(a_zone[lVar2]);
      if (((iVar1 == 0) || (iVar1 = iswdigit(a_zone[lVar2 + 1]), iVar1 == 0)) ||
         (a_zone[lVar2 + 2] != L'\0')) {
        a_zone_local = (wchar_t *)0x0;
      }
      else {
        iVar1 = 0x3c;
        if (*a_zone == L'-') {
          iVar1 = -0x3c;
        }
        a_zone_local = (wchar_t *)
                       ((long)iVar1 *
                       ((long)((a_zone[1] + L'\xffffffd0') * 10 + a_zone[2] + L'\xffffffd0') * 0x3c
                       + (long)((a_zone[lVar2] + L'\xffffffd0') * 10 +
                               a_zone[lVar2 + 1] + L'\xffffffd0')));
      }
    }
    break;
  default:
    a_zone_local = (wchar_t *)0x0;
    break;
  case L'A':
  case L'a':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = 0xe10;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'B':
  case L'b':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = 0x1c20;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'C':
  case L'c':
    a_zone_local = (wchar_t *)f_zone_to_offset_us(a_zone,3,-6);
    break;
  case L'D':
  case L'd':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = 0x3840;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'E':
  case L'e':
    a_zone_local = (wchar_t *)f_zone_to_offset_us(a_zone,5,-5);
    break;
  case L'F':
  case L'f':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = 0x5460;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'G':
  case L'g':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = 0x6270;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'H':
  case L'h':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = 0x7080;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'I':
  case L'i':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = 0x7e90;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'K':
  case L'k':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = 36000;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'L':
  case L'l':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = 0x9ab0;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'M':
  case L'm':
    a_zone_local = (wchar_t *)f_zone_to_offset_us(a_zone,0xc,-7);
    break;
  case L'N':
  case L'n':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = -0xe10;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'O':
  case L'o':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = -0x1c20;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'P':
  case L'p':
    a_zone_local = (wchar_t *)f_zone_to_offset_us(a_zone,-3,-8);
    break;
  case L'Q':
  case L'q':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = -0x3840;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'R':
  case L'r':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = -18000;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'S':
  case L's':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = -0x5460;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'T':
  case L't':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = -0x6270;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'U':
  case L'u':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = -0x7080;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'V':
  case L'v':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = -0x7e90;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'W':
  case L'w':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = -36000;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'X':
  case L'x':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = -0x9ab0;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
    break;
  case L'Y':
  case L'y':
    iVar1 = 0;
    if (a_zone[1] == L'\0') {
      iVar1 = -0xa8c0;
    }
    a_zone_local = (wchar_t *)(long)iVar1;
  }
  return (intptr_t)a_zone_local;
}

Assistant:

intptr_t f_zone_to_offset(const wchar_t* a_zone)
{
	switch (a_zone[0]) {
	case L'+':
	case L'-':
		if (std::iswdigit(a_zone[1]) && std::iswdigit(a_zone[2])) {
			size_t i = a_zone[3] == L':' ? 4 : 3;
			if (!std::iswdigit(a_zone[i]) || !std::iswdigit(a_zone[i + 1]) || a_zone[i + 2] != L'\0') return 0;
			intptr_t hour = (a_zone[1] - L'0') * 10 + (a_zone[2] - L'0');
			intptr_t minute = (a_zone[i] - L'0') * 10 + (a_zone[i + 1] - L'0');
			return (a_zone[0] == L'-' ? -60 : 60) * (hour * 60 + minute);
		} else {
			return 0;
		}
	case L'A':
	case L'a':
		return a_zone[1] == L'\0' ? 1 * 3600 : 0;
	case L'B':
	case L'b':
		return a_zone[1] == L'\0' ? 2 * 3600 : 0;
	case L'C':
	case L'c':
		return f_zone_to_offset_us(a_zone, 3, -6);
	case L'D':
	case L'd':
		return a_zone[1] == L'\0' ? 4 * 3600 : 0;
	case L'E':
	case L'e':
		return f_zone_to_offset_us(a_zone, 5, -5);
	case L'F':
	case L'f':
		return a_zone[1] == L'\0' ? 6 * 3600 : 0;
	case L'G':
	case L'g':
		return a_zone[1] == L'\0' ? 7 * 3600 : 0;
	case L'H':
	case L'h':
		return a_zone[1] == L'\0' ? 8 * 3600 : 0;
	case L'I':
	case L'i':
		return a_zone[1] == L'\0' ? 9 * 3600 : 0;
	case L'K':
	case L'k':
		return a_zone[1] == L'\0' ? 10 * 3600 : 0;
	case L'L':
	case L'l':
		return a_zone[1] == L'\0' ? 11 * 3600 : 0;
	case L'M':
	case L'm':
		return f_zone_to_offset_us(a_zone, 12, -7);
	case L'N':
	case L'n':
		return a_zone[1] == L'\0' ? -1 * 3600 : 0;
	case L'O':
	case L'o':
		return a_zone[1] == L'\0' ? -2 * 3600 : 0;
	case L'P':
	case L'p':
		return f_zone_to_offset_us(a_zone, -3, -8);
	case L'Q':
	case L'q':
		return a_zone[1] == L'\0' ? -4 * 3600 : 0;
	case L'R':
	case L'r':
		return a_zone[1] == L'\0' ? -5 * 3600 : 0;
	case L'S':
	case L's':
		return a_zone[1] == L'\0' ? -6 * 3600 : 0;
	case L'T':
	case L't':
		return a_zone[1] == L'\0' ? -7 * 3600 : 0;
	case L'U':
	case L'u':
		return a_zone[1] == L'\0' ? -8 * 3600 : 0;
	case L'V':
	case L'v':
		return a_zone[1] == L'\0' ? -9 * 3600 : 0;
	case L'W':
	case L'w':
		return a_zone[1] == L'\0' ? -10 * 3600 : 0;
	case L'X':
	case L'x':
		return a_zone[1] == L'\0' ? -11 * 3600 : 0;
	case L'Y':
	case L'y':
		return a_zone[1] == L'\0' ? -12 * 3600 : 0;
	default:
		return 0;
	}
}